

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexPointCloudShape.cpp
# Opt level: O0

void __thiscall
btConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btConvexPointCloudShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,
          int numVectors)

{
  btConvexPointCloudShape *this_00;
  long lVar1;
  btScalar *pbVar2;
  undefined8 *puVar3;
  int in_ECX;
  long in_RDX;
  btVector3 *in_RDI;
  int index;
  btScalar maxDot;
  btVector3 *vec;
  int j;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  btScalar in_stack_ffffffffffffffa4;
  btVector3 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffc0;
  btScalar in_stack_ffffffffffffffc4;
  btScalar local_38 [4];
  btScalar *local_28;
  int local_20;
  int local_1c;
  long local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    local_38 = (btScalar  [4])::operator*(in_stack_ffffffffffffffb0.m_floats._0_8_,in_RDI);
    local_28 = local_38;
    lVar1 = btVector3::maxDot((btVector3 *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb0.m_floats._8_8_,
                              in_stack_ffffffffffffffb0.m_floats._0_8_,in_RDI->m_floats);
    in_stack_ffffffffffffffc0 = (int)lVar1;
    pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(local_18 + (long)local_20 * 0x10));
    pbVar2[3] = -1e+18;
    if (-1 < in_stack_ffffffffffffffc0) {
      this_00 = (btConvexPointCloudShape *)
                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffc4;
      in_stack_ffffffffffffffb0 = getScaledPoint(this_00,in_stack_ffffffffffffff9c);
      puVar3 = (undefined8 *)(local_18 + (long)local_20 * 0x10);
      *puVar3 = in_stack_ffffffffffffffb0.m_floats._0_8_;
      puVar3[1] = in_stack_ffffffffffffffb0.m_floats._8_8_;
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffa4;
      pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(local_18 + (long)local_20 * 0x10));
      pbVar2[3] = in_stack_ffffffffffffffa4;
    }
  }
  return;
}

Assistant:

void	btConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{
    for( int j = 0; j < numVectors; j++ )
    {
        const btVector3& vec = vectors[j] * m_localScaling;  // dot( a*c, b) = dot(a, b*c)
        btScalar maxDot;
        int index = (int) vec.maxDot( &m_unscaledPoints[0], m_numPoints, maxDot);
        supportVerticesOut[j][3] = btScalar(-BT_LARGE_FLOAT);
        if( 0 <= index )
        {
            //WARNING: don't swap next lines, the w component would get overwritten!
            supportVerticesOut[j] = getScaledPoint(index);
            supportVerticesOut[j][3] = maxDot;
        }
    }

}